

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_parse_missing_value(void)

{
  int iVar1;
  char *local_58;
  char *args [4];
  undefined1 local_30 [4];
  undefined1 local_2c [4];
  int j;
  int i;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init((cargo_t *)&j,0,"program");
  if (iVar1 == 0) {
    local_58 = "program";
    args[0] = "--alpha";
    args[1] = "1";
    args[2] = "--beta";
    cargo._4_4_ = cargo_add_option(_j,0,"--alpha -a","The alpha","i",local_2c);
    cargo._4_4_ = cargo_add_option(_j,0,"--beta -b","The beta","i",local_30);
    if (cargo._4_4_ == 0) {
      cargo._4_4_ = cargo_parse(_j,0,1,4,&local_58);
      if (cargo._4_4_ == 0) {
        pcStack_18 = "Succesfully parsed missing value";
      }
    }
    else {
      pcStack_18 = "Failed to add options";
    }
    cargo_destroy((cargo_t *)&j);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_parse_missing_value)
{
    int i;
    int j;
    char *args[] = { "program", "--alpha", "1", "--beta" };

    ret = cargo_add_option(cargo, 0, "--alpha -a", "The alpha", "i", &i);
    ret = cargo_add_option(cargo, 0, "--beta -b", "The beta", "i", &j);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret != 0, "Succesfully parsed missing value");

    _TEST_CLEANUP();
}